

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

bool proto2_unittest::DupEnum_TestEnumWithDupValueLite_Parse
               (string_view name,DupEnum_TestEnumWithDupValueLite *value)

{
  bool bVar1;
  int *in_R9;
  string_view name_00;
  int int_value;
  DupEnum_TestEnumWithDupValueLite local_c;
  
  name_00._M_str = (char *)&local_c;
  name_00._M_len = (size_t)name._M_str;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)DupEnum_TestEnumWithDupValueLite_entries,(EnumEntry *)&DAT_00000005
                     ,name._M_len,name_00,in_R9);
  if (bVar1) {
    *value = local_c;
  }
  return bVar1;
}

Assistant:

bool DupEnum_TestEnumWithDupValueLite_Parse(::absl::string_view name, DupEnum_TestEnumWithDupValueLite* PROTOBUF_NONNULL value) {
  int int_value;
  bool success = ::google::protobuf::internal::LookUpEnumValue(
      DupEnum_TestEnumWithDupValueLite_entries, 5, name, &int_value);
  if (success) {
    *value = static_cast<DupEnum_TestEnumWithDupValueLite>(int_value);
  }
  return success;
}